

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

shared_ptr<phyr::Shape>
phyr::createSphereShape(Transform *o2w,Transform *w2o,bool reverseNormals,double radius)

{
  undefined1 in_CL;
  double *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Transform **in_RSI;
  element_type *in_RDI;
  shared_ptr<phyr::Shape> sVar1;
  element_type *this;
  undefined7 in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  std::make_shared<phyr::Sphere,phyr::Transform_const*&,phyr::Transform_const*&,double&,bool&>
            ((Transform **)in_RDI,in_RSI,in_RDX,
             (bool *)(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff));
  std::shared_ptr<phyr::Shape>::shared_ptr<phyr::Sphere,void>
            ((shared_ptr<phyr::Shape> *)this,(shared_ptr<phyr::Sphere> *)in_RDI);
  std::shared_ptr<phyr::Sphere>::~shared_ptr((shared_ptr<phyr::Sphere> *)0x110a33);
  sVar1.super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<phyr::Shape>)sVar1.super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Shape> createSphereShape(const Transform* o2w,
                                         const Transform* w2o,
                                         bool reverseNormals, Real radius) {
    return std::make_shared<Sphere>(o2w, w2o, radius, reverseNormals);
}